

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vec_Ptr_t * Gia_VtaAbsToFrames(Vec_Int_t *vAbs)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *p;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  iVar6 = vAbs->nSize;
  if (0 < iVar6) {
    iVar1 = *vAbs->pArray;
    if ((-2 < (long)iVar1) && ((int)(iVar1 + 1U) < iVar6)) {
      if (vAbs->pArray[iVar1 + 1U] != iVar6) {
        __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x9a,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
      }
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      iVar6 = 8;
      if (6 < iVar1 - 1U) {
        iVar6 = iVar1;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = iVar6;
      if (iVar6 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((long)iVar6 << 3);
      }
      pVVar3->pArray = ppvVar4;
      if (iVar1 < 1) {
        iVar6 = -1;
      }
      else {
        lVar7 = 0;
        do {
          lVar8 = lVar7 + 1;
          if ((vAbs->nSize <= lVar8) || (vAbs->nSize <= (int)lVar7 + 2)) goto LAB_0057a39e;
          uVar2 = vAbs->pArray[lVar8];
          uVar11 = (ulong)uVar2;
          iVar6 = vAbs->pArray[lVar7 + 2];
          p = (Vec_Int_t *)malloc(0x10);
          iVar10 = iVar6 - uVar2;
          if ((iVar6 - uVar2) - 1 < 0xf) {
            iVar10 = 0x10;
          }
          p->nSize = 0;
          p->nCap = iVar10;
          if (iVar10 == 0) {
            piVar5 = (int *)0x0;
          }
          else {
            piVar5 = (int *)malloc((long)iVar10 << 2);
          }
          p->pArray = piVar5;
          uVar9 = uVar2;
          while ((int)uVar9 < iVar6) {
            if (((int)uVar2 < 0) || (vAbs->nSize <= (int)uVar11)) goto LAB_0057a39e;
            Vec_IntPush(p,vAbs->pArray[uVar11]);
            uVar11 = uVar11 + 1;
            uVar9 = (uint)uVar11;
          }
          uVar2 = pVVar3->nSize;
          uVar9 = pVVar3->nCap;
          if (uVar2 == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              iVar10 = 0x10;
            }
            else {
              iVar10 = uVar9 * 2;
              if (iVar10 <= (int)uVar9) goto LAB_0057a353;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar9 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar9 << 4);
              }
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar10;
          }
LAB_0057a353:
          pVVar3->nSize = uVar2 + 1;
          pVVar3->pArray[(int)uVar2] = p;
          lVar7 = lVar8;
        } while (lVar8 != iVar1);
      }
      if (iVar6 == vAbs->nSize) {
        return pVVar3;
      }
      __assert_fail("iStop == Vec_IntSize(vAbs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                    ,0xa5,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
    }
  }
LAB_0057a39e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Ptr_t * Gia_VtaAbsToFrames( Vec_Int_t * vAbs )
{
    Vec_Ptr_t * vFrames;
    Vec_Int_t * vFrame;
    int i, k, Entry, iStart, iStop = -1;
    int nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    vFrames = Vec_PtrAlloc( nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        vFrame = Vec_IntAlloc( iStop - iStart );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
            Vec_IntPush( vFrame, Entry );
        Vec_PtrPush( vFrames, vFrame );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    return vFrames;
}